

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_do_statement(Parser *this)

{
  ostream *poVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  poVar1 = std::operator<<((ostream *)this->out_file,"\t\t\t<do_statement>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"IDENTIFIER",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"do statement",&local_62);
  check_token_type_x_after_y(this,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  poVar1 = (ostream *)this->out_file;
  std::operator+(&local_40,"\t\t\t\t<identifier>",&this->cur_token);
  std::operator+(&local_60,&local_40,"</identifier>");
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  query_tokenizer(this);
  parse_subroutine_call(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,";",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"subroutine call",&local_62);
  check_expected_x_after_y(this,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  poVar1 = (ostream *)this->out_file;
  std::operator+(&local_40,"\t\t\t\t<symbol>",&this->cur_token);
  std::operator+(&local_60,&local_40,"</symbol>");
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  query_tokenizer(this);
  poVar1 = std::operator<<((ostream *)this->out_file,"\t\t\t</do_statement>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Parser::parse_do_statement() {
    out_file << "\t\t\t<do_statement>" << std::endl;

    check_token_type_x_after_y("IDENTIFIER", "do statement");
    out_file << "\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
    query_tokenizer();

    parse_subroutine_call();

    check_expected_x_after_y(";", "subroutine call");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    out_file << "\t\t\t</do_statement>" << std::endl;

}